

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O3

Sequence * __thiscall kratos::Sequence::imply(Sequence *this,shared_ptr<kratos::Var> *var)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Sequence *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Sequence *pSVar2;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002b88b8;
  pSVar2 = (Sequence *)(p_Var1 + 1);
  p_Var1[1]._vptr__Sp_counted_base =
       (_func_int **)(var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1[2]._M_use_count = 0;
  p_Var1[2]._M_weak_count = 0;
  p_Var1[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  (this->next_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pSVar2;
  this_00 = (this->next_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->next_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    pSVar2 = (this->next_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  pSVar2->parent_ = this;
  return pSVar2;
}

Assistant:

Sequence *Sequence::imply(const std::shared_ptr<Var> &var) {
    next_ = std::make_shared<Sequence>(var);
    next_->parent_ = this;
    return next_.get();
}